

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

Bool Ppmd7_Alloc(CPpmd7 *p,UInt32 size,ISzAlloc *alloc)

{
  long lVar1;
  CPpmd7 *in_RDX;
  uint in_ESI;
  long in_RDI;
  ISzAlloc *in_stack_ffffffffffffffd8;
  
  if ((*(long *)(in_RDI + 0x40) == 0) || (*(uint *)(in_RDI + 0x34) != in_ESI)) {
    Ppmd7_Free(in_RDX,in_stack_ffffffffffffffd8);
    *(uint *)(in_RDI + 0x68) = 4 - (in_ESI & 3);
    lVar1 = (*(code *)in_RDX->MinContext)(in_RDX,*(int *)(in_RDI + 0x68) + in_ESI + 0xc);
    *(long *)(in_RDI + 0x40) = lVar1;
    if (lVar1 == 0) {
      return 0;
    }
    *(uint *)(in_RDI + 0x34) = in_ESI;
  }
  return 1;
}

Assistant:

static Bool Ppmd7_Alloc(CPpmd7 *p, UInt32 size, ISzAlloc *alloc)
{
  if (p->Base == 0 || p->Size != size)
  {
    Ppmd7_Free(p, alloc);
    p->AlignOffset =
      #ifdef PPMD_32BIT
        (4 - size) & 3;
      #else
        4 - (size & 3);
      #endif
    if ((p->Base = (Byte *)alloc->Alloc(alloc, p->AlignOffset + size
        #ifndef PPMD_32BIT
        + UNIT_SIZE
        #endif
        )) == 0)
      return False;
    p->Size = size;
  }
  return True;
}